

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O2

REF_STATUS ref_validation_unused_node(REF_GRID ref_grid)

{
  REF_NODE pRVar1;
  REF_ADJ pRVar2;
  REF_DBL *pRVar3;
  REF_CELL ref_cell;
  int iVar4;
  REF_STATUS RVar5;
  uint uVar6;
  int iVar7;
  REF_CELL *ppRVar8;
  long lVar9;
  ulong uVar10;
  REF_ADJ ref_adj;
  int local_bc;
  long local_b8;
  REF_CELL *local_b0;
  REF_INT nodes [27];
  
  ppRVar8 = ref_grid->cell + 8;
  lVar9 = 8;
  local_bc = 0;
  for (uVar10 = 0; pRVar1 = ref_grid->node, (long)uVar10 < (long)pRVar1->max; uVar10 = uVar10 + 1) {
    if ((((-1 < pRVar1->global[uVar10]) &&
         (((long)(*ppRVar8)->ref_adj->nnode <= (long)uVar10 ||
          ((*ppRVar8)->ref_adj->first[uVar10] == -1)))) &&
        ((pRVar2 = ref_grid->cell[9]->ref_adj, (long)pRVar2->nnode <= (long)uVar10 ||
         (pRVar2->first[uVar10] == -1)))) &&
       (((pRVar2 = ref_grid->cell[10]->ref_adj, (long)pRVar2->nnode <= (long)uVar10 ||
         (pRVar2->first[uVar10] == -1)) &&
        ((pRVar2 = ref_grid->cell[0xb]->ref_adj, (long)pRVar2->nnode <= (long)uVar10 ||
         (pRVar2->first[uVar10] == -1)))))) {
      pRVar3 = pRVar1->real;
      printf(" unused node %d: %e %e %e\n",*(undefined8 *)((long)pRVar3 + lVar9 * 2 + -0x10),
             *(undefined8 *)((long)pRVar3 + lVar9 * 2 + -8),
             *(undefined8 *)((long)pRVar3 + lVar9 * 2),uVar10 & 0xffffffff);
      local_bc = 1;
    }
    lVar9 = lVar9 + 0x3c;
  }
  ref_adj_create(&ref_adj);
  local_b0 = ref_grid->cell;
  lVar9 = 8;
  do {
    if (lVar9 == 0x10) {
      iVar7 = local_bc;
      for (uVar10 = 0; (long)uVar10 < (long)ref_grid->node->max; uVar10 = uVar10 + 1) {
        if ((-1 < ref_grid->node->global[uVar10]) &&
           (((long)ref_adj->nnode <= (long)uVar10 || (ref_adj->first[uVar10] == -1)))) {
          printf(" unused node %d\n",uVar10 & 0xffffffff);
          iVar7 = 1;
        }
      }
      ref_adj_free(ref_adj);
      return (uint)(iVar7 != 0);
    }
    ref_cell = *ppRVar8;
    local_b8 = lVar9;
    for (iVar7 = 0; iVar7 < ref_cell->max; iVar7 = iVar7 + 1) {
      RVar5 = ref_cell_nodes(ref_cell,iVar7,nodes);
      if (RVar5 == 0) {
        iVar4 = (int)local_b8;
        lVar9 = 0;
        while (lVar9 < ref_cell->node_per) {
          uVar6 = ref_adj_add(ref_adj,nodes[lVar9],iVar4 + iVar7 * 4);
          lVar9 = lVar9 + 1;
          if (uVar6 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                   ,0x4f,"ref_validation_unused_node",(ulong)uVar6,"add");
            return uVar6;
          }
        }
      }
    }
    ppRVar8 = local_b0 + local_b8 + 1;
    lVar9 = local_b8 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_validation_unused_node(REF_GRID ref_grid) {
  REF_INT node;
  REF_BOOL problem;
  REF_ADJ ref_adj;
  REF_CELL ref_cell;
  REF_INT group, cell, nodes[REF_CELL_MAX_SIZE_PER];

  problem = REF_FALSE;
  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    if (ref_adj_empty(ref_cell_adj(ref_grid_tet(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pyr(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_pri(ref_grid)), node) &&
        ref_adj_empty(ref_cell_adj(ref_grid_hex(ref_grid)), node)) {
      problem = REF_TRUE;
      printf(" unused node %d: %e %e %e\n", node,
             ref_node_xyz(ref_grid_node(ref_grid), 0, node),
             ref_node_xyz(ref_grid_node(ref_grid), 1, node),
             ref_node_xyz(ref_grid_node(ref_grid), 2, node));
    }
  }

  ref_adj_create(&ref_adj);

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      for (node = 0; node < ref_cell_node_per(ref_cell); node++)
        RSS(ref_adj_add(ref_adj, nodes[node], group + 4 * cell), "add");
    }
  }

  each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
    if (ref_adj_empty(ref_adj, node)) {
      problem = REF_TRUE;
      printf(" unused node %d\n", node);
    }
  }

  ref_adj_free(ref_adj);

  return (problem ? REF_FAILURE : REF_SUCCESS);
}